

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

TextureCubeView *
tcu::getEffectiveTView
          (TextureCubeView *__return_storage_ptr__,TextureCubeView *src,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *storage
          ,Sampler *sampler)

{
  TextureFormat *pTVar1;
  undefined8 *puVar2;
  int numLevels;
  long lVar3;
  long lVar4;
  int faceNdx;
  long lVar5;
  int levelNdx;
  long lVar6;
  long lVar7;
  ConstPixelBufferAccess *storagePtrs [6];
  undefined1 local_90 [24];
  int aiStack_78 [2];
  void *local_70;
  ConstPixelBufferAccess *local_68;
  ConstPixelBufferAccess *local_60;
  ConstPixelBufferAccess *local_58;
  ConstPixelBufferAccess *local_50;
  ConstPixelBufferAccess *local_48;
  ConstPixelBufferAccess *local_40;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::resize
            (storage,(long)(src->m_numLevels * 6));
  local_68 = *(ConstPixelBufferAccess **)storage;
  numLevels = src->m_numLevels;
  local_60 = local_68 + numLevels;
  local_58 = local_68 + numLevels * 2;
  local_50 = local_68 + numLevels * 3;
  local_48 = local_68 + numLevels * 4;
  local_40 = local_68 + numLevels * 5;
  TextureCubeView::TextureCubeView
            (__return_storage_ptr__,numLevels,(ConstPixelBufferAccess *(*) [6])&local_68);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    lVar7 = 0;
    for (lVar6 = 0; lVar6 < src->m_numLevels; lVar6 = lVar6 + 1) {
      toSamplerAccess<tcu::ConstPixelBufferAccess>
                ((ConstPixelBufferAccess *)local_90,
                 (ConstPixelBufferAccess *)
                 ((long)(src->m_levels[lVar5]->m_size).m_data + lVar7 + -8),
                 sampler->depthStencilMode);
      lVar3 = *(long *)storage;
      lVar4 = (long)(src->m_numLevels * (int)lVar5 + (int)lVar6) * 0x28;
      *(void **)(lVar3 + 0x20 + lVar4) = local_70;
      puVar2 = (undefined8 *)(lVar3 + 0x10 + lVar4);
      *puVar2 = local_90._16_8_;
      puVar2[1] = aiStack_78;
      pTVar1 = (TextureFormat *)(lVar3 + lVar4);
      pTVar1->order = local_90._0_4_;
      pTVar1->type = local_90._4_4_;
      pTVar1[1].order = local_90._8_4_;
      pTVar1[1].type = local_90._12_4_;
      lVar7 = lVar7 + 0x28;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TextureCubeView getEffectiveTView (const tcu::TextureCubeView& src, std::vector<tcu::ConstPixelBufferAccess>& storage, const tcu::Sampler& sampler)
{
	storage.resize(tcu::CUBEFACE_LAST * src.getNumLevels());

	const tcu::ConstPixelBufferAccess* storagePtrs[tcu::CUBEFACE_LAST] =
	{
		&storage[0 * src.getNumLevels()],
		&storage[1 * src.getNumLevels()],
		&storage[2 * src.getNumLevels()],
		&storage[3 * src.getNumLevels()],
		&storage[4 * src.getNumLevels()],
		&storage[5 * src.getNumLevels()],
	};

	tcu::TextureCubeView view = tcu::TextureCubeView(src.getNumLevels(), storagePtrs);

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
	for (int levelNdx = 0; levelNdx < src.getNumLevels(); ++levelNdx)
		storage[faceNdx * src.getNumLevels() + levelNdx] = tcu::getEffectiveDepthStencilAccess(src.getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), sampler.depthStencilMode);

	return view;
}